

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong *puVar20;
  size_t sVar21;
  ulong uVar22;
  ulong *puVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong local_b0;
  
  if (bmi2 == 0) {
    sVar9 = 0xffffffffffffffba;
    if (8 < dstCapacity) {
      uVar4 = (ushort)*CTable_MatchLength;
      uVar26 = (ulong)mlCodeTable[nbSeq - 1];
      lVar15 = (long)(1 << ((char)uVar4 - 1U & 0x1f));
      if (uVar4 == 0) {
        lVar15 = 1;
      }
      uVar30 = CTable_MatchLength[lVar15 + uVar26 * 2 + 2] + 0x8000;
      uVar5 = (ushort)*CTable_OffsetBits;
      bVar1 = ofCodeTable[nbSeq - 1];
      uVar11 = (ulong)bVar1;
      lVar16 = (long)(1 << ((char)uVar5 - 1U & 0x1f));
      if (uVar5 == 0) {
        lVar16 = 1;
      }
      uVar27 = CTable_OffsetBits[lVar16 + uVar11 * 2 + 2] + 0x8000;
      uVar6 = *(ushort *)
               ((long)CTable_MatchLength +
               (long)(int)CTable_MatchLength[lVar15 + uVar26 * 2 + 1] * 2 +
               (ulong)((uVar30 & 0xffff0000) - CTable_MatchLength[lVar15 + uVar26 * 2 + 2] >>
                      ((byte)(uVar30 >> 0x10) & 0x3f)) * 2 + 4);
      uVar19 = (ulong)*(ushort *)
                       ((long)CTable_OffsetBits +
                       (long)(int)CTable_OffsetBits[lVar16 + uVar11 * 2 + 1] * 2 +
                       (ulong)((uVar27 & 0xffff0000) - CTable_OffsetBits[lVar16 + uVar11 * 2 + 2] >>
                              ((byte)(uVar27 >> 0x10) & 0x3f)) * 2 + 4);
      uVar7 = (ushort)*CTable_LitLength;
      lVar17 = (long)(1 << ((char)uVar7 - 1U & 0x1f));
      if (uVar7 == 0) {
        lVar17 = 1;
      }
      uVar10 = (ulong)llCodeTable[nbSeq - 1];
      uVar30 = CTable_LitLength[lVar17 + uVar10 * 2 + 2] + 0x8000;
      local_b0 = (ulong)*(ushort *)
                         ((long)CTable_LitLength +
                         (long)(int)CTable_LitLength[lVar17 + uVar10 * 2 + 1] * 2 +
                         (ulong)((uVar30 & 0xffff0000) - CTable_LitLength[lVar17 + uVar10 * 2 + 2]
                                >> ((byte)(uVar30 >> 0x10) & 0x3f)) * 2 + 4);
      bVar2 = ""[uVar10];
      uVar10 = (ulong)((uint)sequences[nbSeq - 1].mlBase & BIT_mask[""[uVar26]]) << (bVar2 & 0x3f) |
               (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[bVar2]);
      uVar30 = (uint)""[uVar26] + (uint)bVar2;
      puVar18 = (ulong *)((long)dst + (dstCapacity - 8));
      puVar13 = (ulong *)dst;
      if (longOffsets == 0) {
        uVar10 = (ulong)(BIT_mask[uVar11] & sequences[nbSeq - 1].offBase) << ((byte)uVar30 & 0x3f) |
                 uVar10;
        uVar30 = uVar30 + bVar1;
      }
      else {
        uVar27 = 0x38;
        if (bVar1 < 0x38) {
          uVar27 = (uint)bVar1;
        }
        uVar25 = bVar1 - uVar27;
        if (0x38 < bVar1) {
          uVar10 = (ulong)(BIT_mask[uVar25] & sequences[nbSeq - 1].offBase) << ((byte)uVar30 & 0x3f)
                   | uVar10;
          uVar30 = uVar30 + uVar25;
          puVar13 = (ulong *)((ulong)(uVar30 >> 3) + (long)dst);
          if (puVar18 < puVar13) {
            puVar13 = puVar18;
          }
          *(ulong *)dst = uVar10;
          uVar10 = uVar10 >> ((byte)uVar30 & 0x38);
          uVar30 = uVar30 & 7;
        }
        uVar10 = (ulong)(sequences[nbSeq - 1].offBase >> ((byte)uVar25 & 0x1f) & BIT_mask[uVar27])
                 << ((byte)uVar30 & 0x3f) | uVar10;
        uVar30 = uVar30 + uVar27;
      }
      puVar20 = (ulong *)((ulong)(uVar30 >> 3) + (long)puVar13);
      if (puVar18 < puVar20) {
        puVar20 = puVar18;
      }
      *puVar13 = uVar10;
      uVar10 = uVar10 >> ((byte)uVar30 & 0x38);
      uVar30 = uVar30 & 7;
      if (1 < nbSeq) {
        uVar26 = nbSeq - 2;
        do {
          uVar29 = (ulong)llCodeTable[uVar26];
          bVar1 = ofCodeTable[uVar26];
          uVar28 = (ulong)bVar1;
          uVar24 = (ulong)mlCodeTable[uVar26];
          uVar11 = CTable_OffsetBits[lVar16 + uVar28 * 2 + 2] + uVar19;
          uVar25 = (uint)uVar19;
          iVar8 = (int)(uVar11 >> 0x10) + uVar30;
          uVar19 = (ulong)*(ushort *)
                           ((long)CTable_OffsetBits +
                           (long)(int)CTable_OffsetBits[lVar16 + uVar28 * 2 + 1] * 2 +
                           (uVar19 >> ((byte)(uVar11 >> 0x10) & 0x3f)) * 2 + 4);
          uVar22 = (ulong)CTable_MatchLength[lVar15 + uVar24 * 2 + 2] + (ulong)uVar6;
          uVar27 = (uint)uVar6;
          iVar14 = (int)(uVar22 >> 0x10) + iVar8;
          uVar12 = CTable_LitLength[lVar17 + uVar29 * 2 + 2] + local_b0;
          uVar6 = *(ushort *)
                   ((long)CTable_MatchLength +
                   (long)(int)CTable_MatchLength[lVar15 + uVar24 * 2 + 1] * 2 +
                   (ulong)(uVar6 >> ((byte)(uVar22 >> 0x10) & 0x3f)) * 2 + 4);
          uVar10 = (ulong)(BIT_mask[uVar12 >> 0x10] & (uint)local_b0) << ((byte)iVar14 & 0x3f) |
                   (ulong)(BIT_mask[uVar22 >> 0x10] & uVar27) << ((byte)iVar8 & 0x3f) |
                   (ulong)(BIT_mask[uVar11 >> 0x10] & uVar25) << (sbyte)uVar30 | uVar10;
          bVar2 = ""[uVar29];
          bVar3 = ""[uVar24];
          uVar30 = (int)(uVar12 >> 0x10) + iVar14;
          local_b0 = (ulong)*(ushort *)
                             ((long)CTable_LitLength +
                             (long)(int)CTable_LitLength[lVar17 + uVar29 * 2 + 1] * 2 +
                             (local_b0 >> ((byte)(uVar12 >> 0x10) & 0x3f)) * 2 + 4);
          uVar27 = (uint)bVar1 + (uint)bVar2 + (uint)bVar3;
          puVar13 = puVar20;
          if (0x1e < uVar27) {
            puVar13 = (ulong *)((ulong)(uVar30 >> 3) + (long)puVar20);
            if (puVar18 < puVar13) {
              puVar13 = puVar18;
            }
            *puVar20 = uVar10;
            uVar10 = uVar10 >> ((byte)uVar30 & 0x38);
            uVar30 = uVar30 & 7;
          }
          uVar10 = (ulong)((uint)sequences[uVar26].mlBase & BIT_mask[(uint)bVar3]) <<
                   ((byte)(uVar30 + bVar2) & 0x3f) |
                   (ulong)((uint)sequences[uVar26].litLength & BIT_mask[bVar2]) <<
                   ((byte)uVar30 & 0x3f) | uVar10;
          uVar30 = uVar30 + bVar2 + (uint)bVar3;
          puVar23 = puVar13;
          if (0x38 < uVar27) {
            puVar23 = (ulong *)((ulong)(uVar30 >> 3) + (long)puVar13);
            if (puVar18 < puVar23) {
              puVar23 = puVar18;
            }
            *puVar13 = uVar10;
            uVar10 = uVar10 >> ((byte)uVar30 & 0x38);
            uVar30 = uVar30 & 7;
          }
          if (longOffsets == 0) {
            uVar10 = (ulong)(BIT_mask[uVar28] & sequences[uVar26].offBase) << ((byte)uVar30 & 0x3f)
                     | uVar10;
            uVar30 = uVar30 + bVar1;
          }
          else {
            uVar27 = (uint)bVar1;
            if (0x37 < bVar1) {
              uVar27 = 0x38;
            }
            uVar25 = bVar1 - uVar27;
            puVar13 = puVar23;
            if (0x38 < bVar1) {
              uVar10 = (ulong)(BIT_mask[uVar25] & sequences[uVar26].offBase) <<
                       ((byte)uVar30 & 0x3f) | uVar10;
              uVar30 = uVar30 + uVar25;
              puVar13 = (ulong *)((ulong)(uVar30 >> 3) + (long)puVar23);
              if (puVar18 < puVar13) {
                puVar13 = puVar18;
              }
              *puVar23 = uVar10;
              uVar10 = uVar10 >> ((byte)uVar30 & 0x38);
              uVar30 = uVar30 & 7;
            }
            uVar10 = (ulong)(sequences[uVar26].offBase >> ((byte)uVar25 & 0x1f) & BIT_mask[uVar27])
                     << ((byte)uVar30 & 0x3f) | uVar10;
            uVar30 = uVar30 + uVar27;
            puVar23 = puVar13;
          }
          puVar20 = (ulong *)((ulong)(uVar30 >> 3) + (long)puVar23);
          if (puVar18 < puVar20) {
            puVar20 = puVar18;
          }
          *puVar23 = uVar10;
          uVar10 = uVar10 >> ((byte)uVar30 & 0x38);
          uVar26 = uVar26 - 1;
          uVar30 = uVar30 & 7;
        } while (uVar26 < nbSeq);
      }
      uVar10 = (ulong)((uint)uVar6 & BIT_mask[uVar4]) << (sbyte)uVar30 | uVar10;
      uVar30 = uVar30 + uVar4;
      puVar13 = (ulong *)((ulong)(uVar30 >> 3) + (long)puVar20);
      if (puVar18 < puVar13) {
        puVar13 = puVar18;
      }
      *puVar20 = uVar10;
      uVar26 = (ulong)((uint)uVar19 & BIT_mask[uVar5]) << (sbyte)(uVar30 & 7) |
               uVar10 >> ((byte)uVar30 & 0x38);
      uVar30 = (uVar30 & 7) + (uint)uVar5;
      puVar20 = (ulong *)((ulong)(uVar30 >> 3) + (long)puVar13);
      if (puVar18 < puVar20) {
        puVar20 = puVar18;
      }
      *puVar13 = uVar26;
      uVar26 = (ulong)((uint)local_b0 & BIT_mask[uVar7]) << (sbyte)(uVar30 & 7) |
               uVar26 >> ((byte)uVar30 & 0x38);
      uVar30 = (uVar30 & 7) + (uint)uVar7;
      *puVar20 = uVar26;
      puVar20 = (ulong *)((ulong)(uVar30 >> 3) + (long)puVar20);
      if (puVar18 < puVar20) {
        puVar20 = puVar18;
      }
      uVar27 = (uVar30 & 7) + 1;
      puVar13 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar20);
      if (puVar18 < puVar13) {
        puVar13 = puVar18;
      }
      *puVar20 = uVar26 >> ((byte)uVar30 & 0x38) | 1L << (uVar30 & 7);
      sVar21 = 0;
      if (puVar13 < puVar18) {
        sVar21 = (long)puVar13 - ((long)dst + ((ulong)((uVar27 & 7) == 0) - 1));
      }
      sVar9 = 0xffffffffffffffba;
      if (sVar21 != 0) {
        sVar9 = sVar21;
      }
    }
    return sVar9;
  }
  sVar9 = ZSTD_encodeSequences_bmi2
                    (dst,dstCapacity,CTable_MatchLength,mlCodeTable,CTable_OffsetBits,ofCodeTable,
                     CTable_LitLength,llCodeTable,sequences,nbSeq,longOffsets);
  return sVar9;
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
    DEBUGLOG(5, "ZSTD_encodeSequences: dstCapacity = %u", (unsigned)dstCapacity);
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}